

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Wrd_t *vFuncs;
  word *__s;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  uint uVar11;
  uint uVar12;
  char *p_00;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong *puVar16;
  
  uVar11 = 1 << ((byte)nOuts & 0x1f);
  uVar4 = vRel->nSize;
  uVar15 = (long)(int)uVar4 / (long)(int)uVar11;
  iVar3 = (int)uVar15;
  uVar2 = nOuts * iVar3 * 2;
  vFuncs = (Vec_Wrd_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < nOuts * iVar3 * 2 - 1U) {
    uVar8 = uVar2;
  }
  vFuncs->nSize = 0;
  vFuncs->nCap = uVar8;
  if (uVar8 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar8 << 3);
  }
  vFuncs->pArray = __s;
  vFuncs->nSize = uVar2;
  uVar8 = 0;
  memset(__s,0,(long)(int)uVar2 << 3);
  if ((uVar4 & uVar11 - 1) != 0) {
    __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x31a,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  uVar4 = iVar3 << 6;
  if (0 < iVar3) {
    uVar12 = 1;
    if (1 < (int)uVar11) {
      uVar12 = uVar11;
    }
    uVar15 = uVar15 & 0xffffffff;
    uVar6 = 1;
    if (1 < (int)uVar4) {
      uVar6 = uVar4;
    }
    uVar5 = 0;
    uVar8 = 0;
    do {
      uVar13 = 0;
      uVar14 = uVar13;
      if (nOuts != 0x1f) {
        do {
          uVar1 = ((int)uVar5 << ((byte)nOuts & 0x1f)) + uVar13;
          uVar14 = uVar13;
          if ((vRel->pArray[(int)uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) break;
          uVar13 = uVar13 + 1;
          uVar14 = uVar12;
        } while (uVar12 != uVar13);
      }
      if (0 < nOuts) {
        puVar10 = __s + uVar15 + (uVar5 >> 6);
        uVar9 = 0;
        uVar7 = 0;
        do {
          if ((uVar14 >> ((uint)uVar7 & 0x1f) & 1) == 0) {
            if (uVar2 <= uVar9) goto LAB_007ba7e6;
            puVar16 = __s + (uVar5 >> 6 & 0x3ffffff) + uVar7 * 2 * uVar15;
          }
          else {
            puVar16 = puVar10;
            if ((ulong)uVar2 <= uVar15 + uVar9) {
LAB_007ba7e6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
          }
          *puVar16 = *puVar16 | 1L << ((byte)uVar5 & 0x3f);
          uVar7 = uVar7 + 1;
          uVar9 = uVar9 + uVar15 * 2;
          puVar10 = puVar10 + uVar15 * 2;
        } while ((uint)nOuts != uVar7);
      }
      uVar8 = uVar8 + (uVar14 == uVar11);
      uVar5 = uVar5 + 1;
    } while ((uint)uVar5 != uVar6);
  }
  if (uVar8 == 0) {
    p_00 = "The relation was successfully determized without don\'t-cares for %d patterns.\n";
    printf("The relation was successfully determized without don\'t-cares for %d patterns.\n",
           (ulong)uVar4);
  }
  else {
    p_00 = "The relation is not well-defined for %d (out of %d) patterns.\n";
    printf("The relation is not well-defined for %d (out of %d) patterns.\n",(ulong)uVar8,
           (ulong)uVar4);
  }
  Gia_ManSimRelCheckFuncs((Gia_Man_t *)p_00,vRel,nOuts,vFuncs);
  return vFuncs;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
        printf( "The relation was successfully determized without don't-cares for %d patterns.\n", 64 * nWords );
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}